

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coleitr.cpp
# Opt level: O3

UBool __thiscall
icu_63::CollationElementIterator::operator==
          (CollationElementIterator *this,CollationElementIterator *that)

{
  ushort uVar1;
  short sVar2;
  UBool UVar3;
  int iVar4;
  char cVar5;
  char cVar6;
  int iVar7;
  bool bVar8;
  
  if (this == that) {
    return '\x01';
  }
  if ((this->rbc_ == that->rbc_) ||
     (iVar4 = (*(this->rbc_->super_Collator).super_UObject._vptr_UObject[3])(), (char)iVar4 != '\0')
     ) {
    if (this->otherHalf_ != that->otherHalf_) {
      return '\0';
    }
    cVar5 = (char)*(undefined4 *)&this->dir_;
    if (cVar5 == '\x01') {
      cVar5 = '\0';
    }
    cVar6 = (char)*(undefined4 *)&that->dir_;
    if (cVar6 == '\x01') {
      cVar6 = '\0';
    }
    if (cVar5 != cVar6) {
      return '\0';
    }
    uVar1 = (this->string_).fUnion.fStackFields.fLengthAndFlags;
    if ((uVar1 & 1) == 0) {
      if ((short)uVar1 < 0) {
        iVar4 = (this->string_).fUnion.fFields.fLength;
      }
      else {
        iVar4 = (int)(short)uVar1 >> 5;
      }
      sVar2 = (that->string_).fUnion.fStackFields.fLengthAndFlags;
      if (sVar2 < 0) {
        iVar7 = (that->string_).fUnion.fFields.fLength;
      }
      else {
        iVar7 = (int)sVar2 >> 5;
      }
      if (((int)sVar2 & 1U) != 0) {
        return '\0';
      }
      if (iVar4 != iVar7) {
        return '\0';
      }
      UVar3 = UnicodeString::doEquals(&this->string_,&that->string_,iVar4);
      bVar8 = UVar3 != '\0';
    }
    else {
      bVar8 = (bool)(*(byte *)&(that->string_).fUnion & 1);
    }
    if (bVar8 != false) {
      iVar4 = (*(this->iter_->super_UObject)._vptr_UObject[3])(this->iter_,that->iter_);
      return (char)iVar4 != '\0';
    }
  }
  return '\0';
}

Assistant:

UBool CollationElementIterator::operator==(
                                    const CollationElementIterator& that) const
{
    if (this == &that) {
        return TRUE;
    }

    return
        (rbc_ == that.rbc_ || *rbc_ == *that.rbc_) &&
        otherHalf_ == that.otherHalf_ &&
        normalizeDir() == that.normalizeDir() &&
        string_ == that.string_ &&
        *iter_ == *that.iter_;
}